

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_b44.c
# Opt level: O2

exr_result_t compress_b44_impl(exr_encode_pipeline_t *encode,int flat_field)

{
  uint8_t uVar1;
  int iVar2;
  uint uVar3;
  exr_coding_channel_info_t *peVar4;
  size_t sVar5;
  int i_2;
  exr_result_t eVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  byte bVar10;
  ushort uVar11;
  int i;
  long lVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  uint16_t *puVar17;
  size_t sVar18;
  uint16_t *puVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  void *pvVar24;
  byte bVar25;
  ulong uVar26;
  uint16_t *puVar27;
  long lVar28;
  size_t sVar29;
  int c;
  uint uVar30;
  long lVar31;
  uint uVar32;
  void *__src;
  uint16_t *puVar33;
  int i_5;
  uint uVar34;
  ushort *local_1d8;
  void *local_1d0;
  uint16_t s [16];
  int d [16];
  uint auStack_e8 [18];
  long local_a0;
  uint16_t *local_98;
  uint16_t *local_90;
  size_t local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ushort local_58 [20];
  
  local_1d8 = (ushort *)encode->compressed_buffer;
  eVar6 = internal_encode_alloc_buffer
                    (encode,EXR_TRANSCODE_BUFFER_SCRATCH1,&encode->scratch_buffer_1,
                     &encode->scratch_alloc_size_1,encode->packed_bytes);
  if (eVar6 == 0) {
    __src = encode->packed_buffer;
    uVar26 = 0;
    while (uVar15 = (uint)uVar26, (int)uVar15 < (encode->chunk).height) {
      iVar2 = (encode->chunk).start_y;
      pvVar24 = encode->scratch_buffer_1;
      lVar16 = 0x19;
      for (lVar31 = 0; lVar31 < encode->channel_count; lVar31 = lVar31 + 1) {
        peVar4 = encode->channels;
        sVar18 = (long)*(char *)((long)&peVar4->channel_name + lVar16) *
                 (long)*(int *)((long)peVar4 + lVar16 + -0xd);
        lVar28 = (long)*(int *)((long)peVar4 + lVar16 + -0x11) * sVar18;
        if (lVar28 != 0) {
          uVar13 = *(uint *)((long)peVar4 + lVar16 + -5);
          uVar7 = uVar15;
          if ((int)uVar13 < 2) {
LAB_00105116:
            memcpy((void *)(uVar7 * sVar18 + (long)pvVar24),__src,sVar18);
            __src = (void *)((long)__src + sVar18);
          }
          else if ((int)(iVar2 + uVar15) % (int)uVar13 == 0) {
            uVar7 = (uint)(uVar26 / uVar13);
            goto LAB_00105116;
          }
          pvVar24 = (void *)((long)pvVar24 + lVar28);
        }
        lVar16 = lVar16 + 0x30;
      }
      uVar26 = (ulong)(uVar15 + 1);
    }
    local_1d0 = encode->scratch_buffer_1;
    sVar29 = 0;
    for (lVar16 = 0; lVar16 < encode->channel_count; lVar16 = lVar16 + 1) {
      peVar4 = encode->channels;
      iVar2 = peVar4[lVar16].width;
      lVar31 = (long)iVar2;
      lVar28 = (long)peVar4[lVar16].height;
      sVar18 = lVar28 * lVar31 * (long)peVar4[lVar16].bytes_per_element;
      if (sVar18 != 0) {
        if (peVar4[lVar16].data_type == 1) {
          local_a0 = lVar16;
          for (uVar26 = 0; (long)uVar26 < lVar28; uVar26 = uVar26 + 4) {
            puVar27 = (uint16_t *)((long)local_1d0 + uVar26 * lVar31 * 2);
            puVar19 = puVar27 + lVar31;
            puVar17 = puVar19 + lVar31;
            if ((long)(uVar26 | 3) < lVar28) {
              puVar33 = puVar17 + lVar31;
            }
            else {
              if (lVar28 <= (long)(uVar26 | 1)) {
                puVar19 = puVar27;
              }
              puVar33 = puVar17;
              if (lVar28 <= (long)(uVar26 | 2)) {
                puVar17 = puVar19;
                puVar33 = puVar19;
              }
            }
            uVar15 = 0;
            sVar5 = sVar29;
            while (sVar29 = sVar5, (int)uVar15 < iVar2) {
              if ((int)(uVar15 | 3) < iVar2) {
                s._0_8_ = *(undefined8 *)puVar27;
                s._8_8_ = *(undefined8 *)puVar19;
                s._16_8_ = *(undefined8 *)puVar17;
                s._24_8_ = *(undefined8 *)puVar33;
              }
              else {
                for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
                  iVar14 = ~uVar15 + iVar2;
                  if ((int)lVar12 < (int)(~uVar15 + iVar2)) {
                    iVar14 = (int)lVar12;
                  }
                  s[lVar12] = puVar27[iVar14];
                  s[lVar12 + 4] = puVar19[iVar14];
                  s[lVar12 + 8] = puVar17[iVar14];
                  s[lVar12 + 0xc] = puVar33[iVar14];
                }
              }
              uVar1 = peVar4[lVar16].p_linear;
              if (uVar1 != '\0') {
                for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
                  s[lVar12] = exrcore_expTable[s[lVar12]];
                }
              }
              puVar27 = puVar27 + 4;
              puVar19 = puVar19 + 4;
              puVar17 = puVar17 + 4;
              puVar33 = puVar33 + 4;
              for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
                uVar11 = s[lVar12];
                if ((~uVar11 & 0x7c00) == 0) {
                  local_58[lVar12] = 0x8000;
                }
                else {
                  if ((short)uVar11 < 0) {
                    uVar11 = ~uVar11;
                  }
                  else {
                    uVar11 = uVar11 | 0x8000;
                  }
                  local_58[lVar12] = uVar11;
                }
              }
              uVar13 = 0;
              for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
                if ((ushort)uVar13 <= local_58[lVar12]) {
                  uVar13 = (uint)local_58[lVar12];
                }
              }
              iVar14 = -1;
              do {
                iVar22 = iVar14 + 1;
                bVar10 = (byte)iVar22;
                for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
                  uVar7 = (uVar13 - local_58[lVar12]) * 2;
                  d[lVar12] = (int)(uVar7 + ~(-1 << (bVar10 & 0x1f)) +
                                   (uint)((uVar7 >> (iVar14 + 2U & 0x1f) & 1) != 0)) >>
                              ((byte)(iVar14 + 2U) & 0x1f);
                }
                uVar34 = d[0] - d[4];
                local_80 = (ulong)uVar34;
                uVar8 = d[4] - d[8];
                local_78 = (ulong)uVar8;
                auStack_e8[1] = uVar8 + 0x20;
                auStack_e8[2] = (d[8] - d[0xc]) + 0x20;
                auStack_e8[3] = (d[0] - d[1]) + 0x20;
                auStack_e8[4] = (d[4] - d[5]) + 0x20;
                uVar23 = d[8] - d[9];
                local_60 = (ulong)uVar23;
                auStack_e8[5] = uVar23 + 0x20;
                auStack_e8[6] = (d[0xc] - d[0xd]) + 0x20;
                auStack_e8[7] = (d[1] - d[2]) + 0x20;
                auStack_e8[8] = (d[5] - d[6]) + 0x20;
                auStack_e8[9] = (d[9] - d[10]) + 0x20;
                auStack_e8[10] = (d[0xd] - d[0xe]) + 0x20;
                auStack_e8[0xb] = (d[2] - d[3]) + 0x20;
                uVar32 = d[6] - d[7];
                local_68 = (ulong)uVar32;
                auStack_e8[0xc] = uVar32 + 0x20;
                uVar20 = d[10] - d[0xb];
                local_70 = (ulong)uVar20;
                auStack_e8[0xd] = uVar20 + 0x20;
                auStack_e8[0xe] = (d[0xe] - d[0xf]) + 0x20;
                uVar21 = uVar34 + 0x20;
                uVar7 = uVar21;
                uVar30 = uVar21;
                for (lVar12 = 1; lVar12 != 0xf; lVar12 = lVar12 + 1) {
                  uVar3 = auStack_e8[lVar12];
                  if ((int)uVar3 <= (int)uVar7) {
                    uVar7 = uVar3;
                  }
                  if ((int)uVar30 <= (int)uVar3) {
                    uVar30 = uVar3;
                  }
                }
                iVar14 = iVar22;
              } while (((int)uVar7 < 0) || (0x3f < (int)uVar30));
              uVar11 = local_58[0];
              if ((flat_field == 0) || ((uVar7 != 0x20 || (bVar25 = 0xfc, uVar30 != 0x20)))) {
                if (uVar1 == '\0') {
                  uVar11 = (ushort)uVar13 - (short)(d[0] << (bVar10 & 0x1f));
                }
                *(byte *)(local_1d8 + 1) = (byte)(uVar21 >> 4) | bVar10 * '\x04';
                *(byte *)((long)local_1d8 + 3) = (byte)(uVar8 + 0x20 >> 2) | (char)uVar34 * '\x10';
                *(byte *)(local_1d8 + 2) = (byte)auStack_e8[2] | (char)uVar8 * '@';
                *(byte *)((long)local_1d8 + 5) =
                     (byte)(auStack_e8[4] >> 4) | (char)auStack_e8[3] * '\x04';
                *(byte *)(local_1d8 + 3) = (byte)(uVar23 + 0x20 >> 2) | (char)(d[4] - d[5]) * '\x10'
                ;
                *(byte *)((long)local_1d8 + 7) = (byte)auStack_e8[6] | (char)uVar23 * '@';
                *(byte *)(local_1d8 + 4) = (byte)(auStack_e8[8] >> 4) | (char)auStack_e8[7] * '\x04'
                ;
                *(byte *)((long)local_1d8 + 9) =
                     (byte)(auStack_e8[9] >> 2) | (char)(d[5] - d[6]) * '\x10';
                *(byte *)(local_1d8 + 5) = (byte)auStack_e8[10] | (char)(d[9] - d[10]) * '@';
                *(byte *)((long)local_1d8 + 0xb) =
                     (byte)(uVar32 + 0x20 >> 4) | (char)auStack_e8[0xb] * '\x04';
                *(byte *)(local_1d8 + 6) = (byte)(uVar20 + 0x20 >> 2) | (char)uVar32 * '\x10';
                bVar25 = (byte)auStack_e8[0xe] | (char)uVar20 * '@';
                lVar12 = 0xd;
                lVar9 = 0xe;
              }
              else {
                lVar12 = 2;
                lVar9 = 3;
              }
              *local_1d8 = uVar11 << 8 | uVar11 >> 8;
              *(byte *)((long)local_1d8 + lVar12) = bVar25;
              local_1d8 = (ushort *)((long)local_1d8 + lVar9);
              uVar15 = uVar15 + 4;
              sVar5 = lVar9 + sVar29;
              local_98 = puVar33;
              local_90 = puVar17;
              local_88 = sVar29;
              if (encode->compressed_alloc_size < lVar9 + sVar29 + 0xe) {
                return 1;
              }
            }
          }
          local_1d0 = (void *)((long)local_1d0 + sVar18);
          lVar16 = local_a0;
        }
        else {
          sVar29 = sVar29 + sVar18;
          if (encode->compressed_alloc_size < sVar29) {
            return 1;
          }
          memcpy(local_1d8,local_1d0,sVar18);
          local_1d8 = (ushort *)((long)local_1d8 + sVar18);
          local_1d0 = (void *)((long)local_1d0 + sVar18);
        }
      }
    }
    encode->compressed_bytes = sVar29;
    eVar6 = 0;
  }
  return eVar6;
}

Assistant:

static exr_result_t
compress_b44_impl (exr_encode_pipeline_t* encode, int flat_field)
{
    uint8_t*       out  = (uint8_t*) encode->compressed_buffer;
    uint64_t       nOut = 0;
    uint8_t *      scratch, *tmp;
    const uint8_t* packed;
    int            nx, ny, wcount;
    uint64_t       bpl, nBytes;
    exr_result_t   rv;

    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(encode->scratch_buffer_1),
        &(encode->scratch_alloc_size_1),
        encode->packed_bytes);
    if (rv != EXR_ERR_SUCCESS) return rv;

    nOut   = 0;
    packed = (const uint8_t*) encode->packed_buffer;
    for (int y = 0; y < encode->chunk.height; ++y)
    {
        int cury = y + encode->chunk.start_y;

        scratch = (uint8_t*) encode->scratch_buffer_1;
        for (int c = 0; c < encode->channel_count; ++c)
        {
            const exr_coding_channel_info_t* curc = encode->channels + c;

            nx     = curc->width;
            ny     = curc->height;
            bpl    = ((uint64_t) (nx)) * (uint64_t) (curc->bytes_per_element);
            nBytes = ((uint64_t) (ny)) * bpl;

            if (nBytes == 0) continue;

            tmp = scratch;
            if (curc->y_samples > 1)
            {
                if ((cury % curc->y_samples) != 0)
                {
                    scratch += nBytes;
                    continue;
                }
                tmp += ((uint64_t) (y / curc->y_samples)) * bpl;
            }
            else { tmp += ((uint64_t) y) * bpl; }

            memcpy (tmp, packed, bpl);
            if (curc->data_type == EXR_PIXEL_HALF) priv_to_native16 (tmp, nx);
            packed += bpl;
            scratch += nBytes;
        }
    }

    nOut    = 0;
    scratch = (uint8_t*) encode->scratch_buffer_1;
    for (int c = 0; c < encode->channel_count; ++c)
    {
        const exr_coding_channel_info_t* curc = encode->channels + c;

        nx     = curc->width;
        ny     = curc->height;
        bpl    = (uint64_t) (nx) * (uint64_t) (curc->bytes_per_element);
        nBytes = ((uint64_t) (ny)) * bpl;

        if (nBytes == 0) continue;

        if (curc->data_type != EXR_PIXEL_HALF)
        {
            if (nOut + nBytes > encode->compressed_alloc_size)
                return EXR_ERR_OUT_OF_MEMORY;
            memcpy (out, scratch, nBytes);
            out += nBytes;
            scratch += nBytes;
            nOut += nBytes;
            continue;
        }

        for (int y = 0; y < ny; y += 4)
        {
            //
            // Copy the next 4x4 pixel block into array s.
            // If the width, cd.nx, or the height, cd.ny, of
            // the pixel data in _tmpBuffer is not divisible
            // by 4, then pad the data by repeating the
            // rightmost column and the bottom row.
            //

            uint16_t* row0 = (uint16_t*) scratch;
            row0 += y * nx;
            uint16_t* row1 = row0 + nx;
            uint16_t* row2 = row1 + nx;
            uint16_t* row3 = row2 + nx;

            if (y + 3 >= ny)
            {
                if (y + 1 >= ny) row1 = row0;
                if (y + 2 >= ny) row2 = row1;

                row3 = row2;
            }

            for (int x = 0; x < nx; x += 4)
            {
                uint16_t s[16];

                if (x + 3 >= nx)
                {
                    int n = nx - x;

                    for (int i = 0; i < 4; ++i)
                    {
                        int j = i;
                        if (j > n - 1) j = n - 1;

                        s[i + 0]  = row0[j];
                        s[i + 4]  = row1[j];
                        s[i + 8]  = row2[j];
                        s[i + 12] = row3[j];
                    }
                }
                else
                {
                    memcpy (&s[0], row0, 4 * sizeof (uint16_t));
                    memcpy (&s[4], row1, 4 * sizeof (uint16_t));
                    memcpy (&s[8], row2, 4 * sizeof (uint16_t));
                    memcpy (&s[12], row3, 4 * sizeof (uint16_t));
                }

                row0 += 4;
                row1 += 4;
                row2 += 4;
                row3 += 4;

                //
                // Compress the contents of array s and append the
                // results to the output buffer.
                //

                if (curc->p_linear) convertFromLinear (s);

                wcount = pack (s, out, flat_field, !(curc->p_linear));
                out += wcount;
                nOut += (uint64_t) wcount;
                if (nOut + 14 > encode->compressed_alloc_size)
                    return EXR_ERR_OUT_OF_MEMORY;
            }
        }
        scratch += nBytes;
    }

    encode->compressed_bytes = nOut;
    return rv;
}